

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t unpack_16bit_3chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  void *pvVar5;
  ulong uVar6;
  uint8_t *puVar7;
  long lVar8;
  void *pvVar9;
  void *pvVar10;
  int iVar11;
  uint8_t *puVar12;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    pvVar5 = decode->unpacked_buffer;
    uVar2 = peVar4->width;
    puVar7 = (peVar4->field_12).decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    lVar8 = (long)(int)(uVar2 * 6);
    pvVar9 = (void *)((long)pvVar5 + (long)(int)uVar2 * 4);
    pvVar10 = (void *)((long)pvVar5 + (long)(int)uVar2 * 2);
    iVar11 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar6 = 0;
        puVar12 = puVar7;
        do {
          *(undefined2 *)puVar12 = *(undefined2 *)((long)pvVar5 + uVar6 * 2);
          *(undefined2 *)(puVar12 + 2) = *(undefined2 *)((long)pvVar10 + uVar6 * 2);
          *(undefined2 *)(puVar12 + 4) = *(undefined2 *)((long)pvVar9 + uVar6 * 2);
          puVar12 = puVar12 + 6;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      pvVar5 = (void *)((long)pvVar5 + lVar8);
      puVar7 = puVar7 + iVar3;
      iVar11 = iVar11 + 1;
      pvVar9 = (void *)((long)pvVar9 + lVar8);
      pvVar10 = (void *)((long)pvVar10 + lVar8);
    } while (iVar11 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        uint16_t* out = (uint16_t*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = one_to_native16 (in0[x]);
            out[1] = one_to_native16 (in1[x]);
            out[2] = one_to_native16 (in2[x]);
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}